

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

int SetHTTPrequest(OperationConfig *config,HttpReq req,HttpReq *store)

{
  undefined8 local_58;
  char *reqname [5];
  HttpReq *store_local;
  HttpReq req_local;
  OperationConfig *config_local;
  
  memcpy(&local_58,&DAT_00135ff0,0x28);
  if ((*store == HTTPREQ_UNSPEC) || (*store == req)) {
    *store = req;
    config_local._4_4_ = 0;
  }
  else {
    warnf(config->global,
          "You can only select one HTTP request method! You asked for both %s and %s.\n",
          reqname[(ulong)req - 1],reqname[(ulong)*store - 1]);
    config_local._4_4_ = 1;
  }
  return config_local._4_4_;
}

Assistant:

int SetHTTPrequest(struct OperationConfig *config, HttpReq req, HttpReq *store)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *reqname[]= {
    "", /* unspec */
    "GET (-G, --get)",
    "HEAD (-I, --head)",
    "multipart formpost (-F, --form)",
    "POST (-d, --data)"
  };

  if((*store == HTTPREQ_UNSPEC) ||
     (*store == req)) {
    *store = req;
    return 0;
  }
  warnf(config->global, "You can only select one HTTP request method! "
        "You asked for both %s and %s.\n",
        reqname[req], reqname[*store]);

  return 1;
}